

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

void __thiscall ON_SimpleArray<ON_3dex>::Append(ON_SimpleArray<ON_3dex> *this,ON_3dex *x)

{
  int iVar1;
  int iVar2;
  ON_3dex *pOVar3;
  void *temp;
  ON_3dex *pOStack_20;
  int newcapacity;
  ON_3dex *p;
  ON_3dex *x_local;
  ON_SimpleArray<ON_3dex> *this_local;
  
  pOStack_20 = x;
  if (this->m_count == this->m_capacity) {
    iVar2 = NewCapacity(this);
    if ((this->m_a <= x) && (x < this->m_a + this->m_capacity)) {
      pOStack_20 = (ON_3dex *)onmalloc(0xc);
      iVar1 = x->j;
      pOStack_20->i = x->i;
      pOStack_20->j = iVar1;
      pOStack_20->k = x->k;
    }
    Reserve(this,(long)iVar2);
    if (this->m_a == (ON_3dex *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  iVar2 = this->m_count;
  this->m_count = iVar2 + 1;
  pOVar3 = this->m_a + iVar2;
  iVar2 = pOStack_20->j;
  pOVar3->i = pOStack_20->i;
  pOVar3->j = iVar2;
  pOVar3->k = pOStack_20->k;
  if (pOStack_20 != x) {
    onfree(pOStack_20);
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}